

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O2

bool __thiscall
crnlib::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  vector<unsigned_char> *other;
  uint uVar1;
  params *ppVar2;
  uint min_error;
  int iVar3;
  uint uVar4;
  ulong __n;
  int iVar5;
  uint uVar6;
  color_quad_u8 *c1;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  color_quad_u8 base_color;
  color_quad_u8 block_colors [4];
  uint block_inten_midpoints [3];
  uint block_inten [4];
  
  ppVar2 = this->m_pParams;
  if (ppVar2->m_constrain_against_base_color5 == true) {
    iVar3 = (uint)(coords->m_unscaled_color).field_0.field_0.r -
            (uint)(ppVar2->m_base_color5).field_0.field_0.r;
    iVar7 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
            (uint)(ppVar2->m_base_color5).field_0.field_0.g;
    iVar5 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
            (uint)(ppVar2->m_base_color5).field_0.field_0.b;
    iVar9 = iVar7;
    if (iVar3 < iVar7) {
      iVar9 = iVar3;
    }
    if (iVar5 <= iVar9) {
      iVar9 = iVar5;
    }
    if (-5 < iVar9) {
      if (iVar7 < iVar3) {
        iVar7 = iVar3;
      }
      if (iVar7 <= iVar5) {
        iVar7 = iVar5;
      }
      if (iVar7 < 4) goto LAB_00171192;
    }
    trial_solution->m_valid = false;
  }
  else {
LAB_00171192:
    etc1_solution_coordinates::get_scaled_color((etc1_solution_coordinates *)&base_color);
    uVar1 = this->m_pParams->m_num_src_pixels;
    __n = (ulong)uVar1;
    trial_solution->m_error = 0xffffffffffffffff;
    other = &this->m_temp_selectors;
    for (uVar6 = 7; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        iVar9 = (&g_etc1_inten_tables)[lVar8 + (ulong)uVar6 * 4];
        uVar13 = iVar9 + (uint)base_color.field_0.field_0.r;
        uVar11 = iVar9 + (uint)base_color.field_0.field_0.g;
        uVar10 = iVar9 + (uint)base_color.field_0.field_0.b;
        uVar12 = 0xff;
        if (uVar13 < 0xff) {
          uVar12 = uVar13;
        }
        if ((int)uVar13 < 0) {
          uVar12 = 0;
        }
        uVar13 = 0xff;
        if (uVar11 < 0xff) {
          uVar13 = uVar11;
        }
        if ((int)uVar11 < 0) {
          uVar13 = 0;
        }
        uVar11 = 0xff;
        if (uVar10 < 0xff) {
          uVar11 = uVar10;
        }
        if ((int)uVar10 < 0) {
          uVar11 = 0;
        }
        block_colors[lVar8].field_0.field_0.r = (uchar)uVar12;
        block_colors[lVar8].field_0.field_0.g = (uchar)uVar13;
        block_colors[lVar8].field_0.field_0.b = (uchar)uVar11;
        block_colors[lVar8].field_0.field_0.a = '\0';
        block_inten[lVar8] = (uVar11 & 0xff) + (uVar13 & 0xff) + (uVar12 & 0xff);
      }
      block_inten_midpoints[0] = block_inten[1] + block_inten[0];
      block_inten_midpoints[1] = block_inten[1] + block_inten[2];
      block_inten_midpoints[2] = block_inten[2] + block_inten[3];
      c1 = this->m_pParams->m_pSrc_pixels;
      uVar13 = this->m_pSorted_luma[uVar1 - 1];
      if (uVar13 * 2 < block_inten[1] + block_inten[0]) {
        if ((block_inten[0] < uVar13 || block_inten[0] - uVar13 == 0) ||
           ((ulong)(block_inten[0] - uVar13) < trial_solution->m_error)) {
          memset(other->m_p,0,__n);
          uVar17 = 0;
          uVar14 = __n;
          while (bVar18 = uVar14 != 0, uVar14 = uVar14 - 1, bVar18) {
            uVar4 = crnlib::color::elucidian_distance(block_colors,c1,false);
            uVar17 = uVar17 + uVar4;
            c1 = c1 + 1;
          }
          goto LAB_00171442;
        }
      }
      else {
        uVar13 = *this->m_pSorted_luma;
        if (uVar13 * 2 < block_inten[2] + block_inten[3]) {
          uVar17 = 0;
          uVar15 = 0;
          for (uVar14 = 0; uVar16 = __n, uVar14 != __n; uVar14 = uVar14 + 1) {
            while (block_inten_midpoints[uVar15] <= this->m_pSorted_luma[uVar14] * 2) {
              uVar13 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar13;
              if (2 < uVar13) {
                uVar16 = uVar14 & 0xffffffff;
                goto LAB_0017143b;
              }
            }
            uVar13 = this->m_pSorted_luma_indices[uVar14];
            (this->m_temp_selectors).m_p[uVar13] = (uchar)uVar15;
            uVar4 = crnlib::color::elucidian_distance(block_colors + uVar15,c1 + uVar13,false);
            uVar17 = uVar17 + uVar4;
          }
LAB_0017143b:
          for (; uVar16 < __n; uVar16 = uVar16 + 1) {
            uVar13 = this->m_pSorted_luma_indices[uVar16];
            (this->m_temp_selectors).m_p[uVar13] = '\x03';
            uVar4 = crnlib::color::elucidian_distance(block_colors + 3,c1 + uVar13,false);
            uVar17 = uVar17 + uVar4;
          }
        }
        else {
          if ((block_inten[3] <= uVar13 && uVar13 - block_inten[3] != 0) &&
             (trial_solution->m_error <= (ulong)(uVar13 - block_inten[3]))) goto LAB_00171480;
          memset(other->m_p,3,__n);
          uVar17 = 0;
          uVar14 = __n;
          while (bVar18 = uVar14 != 0, uVar14 = uVar14 - 1, bVar18) {
            uVar4 = crnlib::color::elucidian_distance(block_colors + 3,c1,false);
            uVar17 = uVar17 + uVar4;
            c1 = c1 + 1;
          }
        }
LAB_00171442:
        if (uVar17 < trial_solution->m_error) {
          trial_solution->m_error = uVar17;
          (trial_solution->m_coords).m_inten_table = uVar6;
          vector<unsigned_char>::swap(&trial_solution->m_selectors,other);
          trial_solution->m_valid = true;
          if (uVar17 == 0) break;
        }
      }
LAB_00171480:
    }
    (trial_solution->m_coords).m_unscaled_color.field_0.field_0.r =
         (coords->m_unscaled_color).field_0.field_0.r;
    (trial_solution->m_coords).m_unscaled_color.field_0.field_0.g =
         (coords->m_unscaled_color).field_0.field_0.g;
    (trial_solution->m_coords).m_unscaled_color.field_0.field_0.b =
         (coords->m_unscaled_color).field_0.field_0.b;
    (trial_solution->m_coords).m_unscaled_color.field_0.field_0.a =
         (coords->m_unscaled_color).field_0.field_0.a;
    (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
    if ((pBest_solution != (potential_solution *)0x0) &&
       (trial_solution->m_error < pBest_solution->m_error)) {
      potential_solution::operator=(pBest_solution,trial_solution);
      return true;
    }
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution)
    {
        if (m_pParams->m_constrain_against_base_color5)
        {
            const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
            const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
            const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

            if ((math::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (math::maximum(dr, dg, db) > cETC1ColorDeltaMax))
            {
                trial_solution.m_valid = false;
                return false;
            }
        }

        const color_quad_u8 base_color(coords.get_scaled_color());

        const uint n = m_pParams->m_num_src_pixels;
        CRNLIB_ASSERT(trial_solution.m_selectors.size() == n);

        trial_solution.m_error = cUINT64_MAX;

        for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table)
        {
            const int* pInten_table = g_etc1_inten_tables[inten_table];

            uint block_inten[4];
            color_quad_u8 block_colors[4];
            for (uint s = 0; s < 4; s++)
            {
                const int yd = pInten_table[s];
                color_quad_u8 block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
                block_colors[s] = block_color;
                block_inten[s] = block_color.r + block_color.g + block_color.b;
            }

            // evaluate_solution_fast() enforces/assumesd a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
            // The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
            // 0   1   2   3
            //   01  12  23
            const uint block_inten_midpoints[3] = { block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3] };

            uint64 total_error = 0;
            const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
            if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
            {
                if (block_inten[0] > m_pSorted_luma[n - 1])
                {
                    const uint min_error = block_inten[0] - m_pSorted_luma[n - 1];
                    if (min_error >= trial_solution.m_error)
                    {
                        continue;
                    }
                }

                memset(&m_temp_selectors[0], 0, n);

                for (uint c = 0; c < n; c++)
                {
                    total_error += color::elucidian_distance(block_colors[0], pSrc_pixels[c], false);
                }
            }
            else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
            {
                if (m_pSorted_luma[0] > block_inten[3])
                {
                    const uint min_error = m_pSorted_luma[0] - block_inten[3];
                    if (min_error >= trial_solution.m_error)
                    {
                        continue;
                    }
                }

                memset(&m_temp_selectors[0], 3, n);

                for (uint c = 0; c < n; c++)
                {
                    total_error += color::elucidian_distance(block_colors[3], pSrc_pixels[c], false);
                }
            }
            else
            {
                uint cur_selector = 0, c;
                for (c = 0; c < n; c++)
                {
                    const uint y = m_pSorted_luma[c];
                    while ((y * 2) >= block_inten_midpoints[cur_selector])
                    {
                        if (++cur_selector > 2)
                        {
                            goto done;
                        }
                    }
                    const uint sorted_pixel_index = m_pSorted_luma_indices[c];
                    m_temp_selectors[sorted_pixel_index] = static_cast<uint8>(cur_selector);
                    total_error += color::elucidian_distance(block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
                }
            done:
                while (c < n)
                {
                    const uint sorted_pixel_index = m_pSorted_luma_indices[c];
                    m_temp_selectors[sorted_pixel_index] = 3;
                    total_error += color::elucidian_distance(block_colors[3], pSrc_pixels[sorted_pixel_index], false);
                    ++c;
                }
            }

            if (total_error < trial_solution.m_error)
            {
                trial_solution.m_error = total_error;
                trial_solution.m_coords.m_inten_table = inten_table;
                trial_solution.m_selectors.swap(m_temp_selectors);
                trial_solution.m_valid = true;
                if (!total_error)
                {
                    break;
                }
            }
        }
        trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
        trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

        bool success = false;
        if (pBest_solution)
        {
            if (trial_solution.m_error < pBest_solution->m_error)
            {
                *pBest_solution = trial_solution;
                success = true;
            }
        }

        return success;
    }